

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

date_t __thiscall
duckdb::TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::
Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>
          (OriginWidthConvertibleToMicrosTernaryOperator *this,interval_t bucket_width,date_t ts,
          date_t origin)

{
  timestamp_t tVar1;
  bool bVar2;
  long right;
  long lVar3;
  long lVar4;
  timestamp_t tVar5;
  date_t dVar6;
  long left;
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  date_t result;
  timestamp_t local_60;
  string local_58;
  OriginWidthConvertibleToMicrosTernaryOperator *local_38;
  int64_t local_30;
  
  local_30 = bucket_width._0_8_;
  dVar6.days = bucket_width.micros._0_4_;
  local_38 = this;
  bVar2 = duckdb::Value::IsFinite<duckdb::date_t>(dVar6);
  if (bVar2) {
    right = duckdb::Interval::GetMicro((interval_t *)&local_38);
    bVar2 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar6,&local_60,false);
    if (!bVar2) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_58,(duckdb *)(ulong)(uint)dVar6.days,(date_t)auVar8._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_58);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    tVar5.value._4_4_ = local_60.value._4_4_;
    tVar5.value._0_4_ = (int32_t)local_60.value;
    lVar3 = duckdb::Timestamp::GetEpochMicroSeconds(tVar5);
    bVar2 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(ts,&local_60,false);
    if (!bVar2) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_58,(duckdb *)(ulong)(uint)ts.days,(date_t)auVar8._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_58);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    tVar1.value._4_4_ = local_60.value._4_4_;
    tVar1.value._0_4_ = (int32_t)local_60.value;
    lVar4 = duckdb::Timestamp::GetEpochMicroSeconds(tVar1);
    lVar3 = SubtractOperatorOverflowCheck::Operation<long,long,long>(lVar3,lVar4 % right);
    left = lVar3 - lVar3 % right;
    if (lVar3 % right != 0 && lVar3 < 0) {
      left = SubtractOperatorOverflowCheck::Operation<long,long,long>(left,right);
    }
    tVar5.value = duckdb::Timestamp::FromEpochMicroSeconds(left + lVar4 % right);
    bVar2 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::date_t>
                      (tVar5,(date_t *)&local_60,false);
    if (!bVar2) {
      auVar7 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::date_t>
                (&local_58,(duckdb *)tVar5.value,(timestamp_t)auVar7._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar7._0_8_,(string *)&local_58);
      __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar2 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::date_t>
                      (dVar6,(date_t *)&local_60,false);
    if (!bVar2) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::date_t>
                (&local_58,(duckdb *)(ulong)(uint)dVar6.days,(date_t)auVar8._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_58);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return (date_t)(int32_t)local_60.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(ts));
			int64_t origin_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(origin));
			return Cast::template Operation<timestamp_t, TR>(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, origin_micros));
		}